

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O1

SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
__thiscall
SafeInt<unsigned_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
operator<<(SafeInt<unsigned_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
           *this,SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                 bits)

{
  if (bits.m_int < '\0') {
    __assert_fail("!std::numeric_limits< U >::is_signed || (U)bits >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dcleblanc[P]SafeInt/Test/../SafeInt.hpp"
                  ,0x1776,
                  "SafeInt<T, E> SafeInt<unsigned char>::operator<<(SafeInt<U, E>) const [T = unsigned char, E = safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>, U = signed char]"
                 );
  }
  if (bits.m_int < '\b') {
    return (SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
            )((char)*this << (bits.m_int & 0x1fU));
  }
  __assert_fail("(U)bits < (int)safeint_internal::int_traits< T >::bitCount",
                "/workspace/llm4binary/github/license_c_cmakelists/dcleblanc[P]SafeInt/Test/../SafeInt.hpp"
                ,0x1777,
                "SafeInt<T, E> SafeInt<unsigned char>::operator<<(SafeInt<U, E>) const [T = unsigned char, E = safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>, U = signed char]"
               );
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator <<( SafeInt< U, E > bits ) const SAFEINT_NOTHROW
    {
        ShiftAssert( !std::numeric_limits< U >::is_signed || (U)bits >= 0 );
        ShiftAssert( (U)bits < (int)safeint_internal::int_traits< T >::bitCount );

        return SafeInt< T, E >( (T)( m_int << (U)bits ) );
    }